

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permissions.cpp
# Opt level: O3

string * fs_get_permissions_abi_cxx11_(string_view path)

{
  string_view path_00;
  _Bool _Var1;
  ulong uVar2;
  char *in_RDX;
  size_t in_RSI;
  string *in_RDI;
  ulong uVar3;
  string_view fname;
  error_code ec;
  size_type *local_90;
  size_type local_88;
  size_type local_80;
  undefined8 uStack_78;
  error_code local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  path local_50;
  
  local_90 = &local_80;
  local_60._M_len = in_RSI;
  local_60._M_str = in_RDX;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"---------","");
  local_70._M_value = 0;
  local_70._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_50,&local_60,auto_format);
  uVar2 = std::filesystem::status(&local_50,&local_70);
  std::filesystem::__cxx11::path::~path(&local_50);
  if (local_70._M_value == 0) {
    uVar3 = uVar2 >> 0x20;
    if (((uint)(uVar2 >> 0x28) & 1) != 0) {
      *(char *)local_90 = 'r';
    }
    if ((char)(uVar2 >> 0x20) < '\0') {
      *(char *)((long)local_90 + 1) = 'w';
    }
    if ((uVar3 & 0x40) != 0) {
      *(char *)((long)local_90 + 2) = 'x';
    }
    _Var1 = fs_is_windows();
    if (!_Var1) {
      if ((uVar3 & 0x20) != 0) {
        *(char *)((long)local_90 + 3) = 'r';
      }
      if ((uVar3 & 0x10) != 0) {
        *(char *)((long)local_90 + 4) = 'w';
      }
      if ((uVar3 & 8) != 0) {
        *(char *)((long)local_90 + 5) = 'x';
      }
      if ((uVar3 & 4) != 0) {
        *(char *)((long)local_90 + 6) = 'r';
      }
      if ((uVar3 & 2) != 0) {
        *(char *)((long)local_90 + 7) = 'w';
      }
      if ((uVar3 & 1) != 0) {
        *(char *)(local_90 + 1) = 'x';
      }
    }
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    if (local_90 == &local_80) {
      (in_RDI->field_2)._M_allocated_capacity = local_80;
      *(undefined8 *)((long)&in_RDI->field_2 + 8) = uStack_78;
    }
    else {
      (in_RDI->_M_dataplus)._M_p = (pointer)local_90;
      (in_RDI->field_2)._M_allocated_capacity = local_80;
    }
    in_RDI->_M_string_length = local_88;
  }
  else {
    path_00._M_str = local_60._M_str;
    path_00._M_len = local_60._M_len;
    fname._M_str = "fs_get_permissions";
    fname._M_len = 0x12;
    fs_print_error(path_00,fname,&local_70);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
  }
  return in_RDI;
}

Assistant:

std::string fs_get_permissions(std::string_view path)
{

  std::string r = "---------";

#ifdef HAVE_CXX_FILESYSTEM
  std::error_code ec;
  const auto s = std::filesystem::status(path, ec);
  if(ec)  FFS_UNLIKELY
  {
    fs_print_error(path, __func__, ec);
    return {};
  }

  const std::filesystem::perms p = s.permissions();

#if defined(__cpp_using_enum)  // C++20
  using enum std::filesystem::perms;
#else
  constexpr std::filesystem::perms none = std::filesystem::perms::none;
  constexpr std::filesystem::perms owner_read = std::filesystem::perms::owner_read;
  constexpr std::filesystem::perms owner_write = std::filesystem::perms::owner_write;
  constexpr std::filesystem::perms owner_exec = std::filesystem::perms::owner_exec;
  constexpr std::filesystem::perms group_read = std::filesystem::perms::group_read;
  constexpr std::filesystem::perms group_write = std::filesystem::perms::group_write;
  constexpr std::filesystem::perms group_exec = std::filesystem::perms::group_exec;
  constexpr std::filesystem::perms others_read = std::filesystem::perms::others_read;
  constexpr std::filesystem::perms others_write = std::filesystem::perms::others_write;
  constexpr std::filesystem::perms others_exec = std::filesystem::perms::others_exec;
#endif

  if ((p & owner_read) != none)
    r[0] = 'r';
  if ((p & owner_write) != none)
    r[1] = 'w';
  if ((p & owner_exec) != none)
    r[2] = 'x';

  if(!fs_is_windows()){

  if ((p & group_read) != none)
    r[3] = 'r';
  if ((p & group_write) != none)
    r[4] = 'w';
  if ((p & group_exec) != none)
    r[5] = 'x';
  if ((p & others_read) != none)
    r[6] = 'r';
  if ((p & others_write) != none)
    r[7] = 'w';
  if ((p & others_exec) != none)
    r[8] = 'x';

  }

#else

  const int m = fs_st_mode(path);
  if(m == 0) FFS_UNLIKELY
  {
    fs_print_error(path, __func__);
    return {};
  }

#if defined(_MSC_VER)
  if (m & _S_IREAD)
    r[0] = 'r';
  if (m & _S_IWRITE)
    r[1] = 'w';
  if (m & _S_IEXEC)
    r[2] = 'x';
#else
  if (m & S_IRUSR)
    r[0] = 'r';
  if (m & S_IWUSR)
    r[1] = 'w';
  if (m & S_IXUSR)
    r[2] = 'x';
#endif

#if !defined(_WIN32)
  if (m & S_IRGRP)
    r[3] = 'r';
  if (m & S_IWGRP)
    r[4] = 'w';
  if (m & S_IXGRP)
    r[5] = 'x';
  if (m & S_IROTH)
    r[6] = 'r';
  if (m & S_IWOTH)
    r[7] = 'w';
  if (m & S_IXOTH)
    r[8] = 'x';
#endif

#endif

  return r;
}